

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMem.c
# Opt level: O1

Aig_MmStep_t * Aig_MmStepStart(int nSteps)

{
  int iVar1;
  Aig_MmStep_t *pAVar2;
  Aig_MmFixed_t **ppAVar3;
  Aig_MmFixed_t *pAVar4;
  Aig_MmFixed_t **ppAVar5;
  char **ppcVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  pAVar2 = (Aig_MmStep_t *)malloc(0x30);
  *(undefined8 *)pAVar2 = 0;
  pAVar2->pMems = (Aig_MmFixed_t **)0x0;
  *(undefined8 *)&pAVar2->nMapSize = 0;
  pAVar2->pMap = (Aig_MmFixed_t **)0x0;
  pAVar2->nChunksAlloc = 0;
  pAVar2->nChunks = 0;
  pAVar2->pChunks = (char **)0x0;
  pAVar2->nMems = nSteps;
  ppAVar3 = (Aig_MmFixed_t **)malloc((long)nSteps * 8);
  pAVar2->pMems = ppAVar3;
  if (0 < nSteps) {
    uVar9 = 0;
    do {
      pAVar4 = Aig_MmFixedStart(8 << ((byte)uVar9 & 0x1f),0x2000);
      ppAVar3[uVar9] = pAVar4;
      uVar9 = uVar9 + 1;
    } while ((uint)nSteps != uVar9);
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pAVar2->nMapSize = iVar1;
  ppAVar5 = (Aig_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  pAVar2->pMap = ppAVar5;
  *ppAVar5 = (Aig_MmFixed_t *)0x0;
  pAVar4 = *ppAVar3;
  lVar7 = 0;
  do {
    ppAVar5[lVar7 + 1] = pAVar4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (0 < nSteps) {
    uVar9 = 0;
    do {
      iVar8 = 4 << ((byte)uVar9 & 0x1f);
      iVar1 = 8 << ((byte)uVar9 & 0x1f);
      if (iVar8 < iVar1) {
        pAVar4 = ppAVar3[uVar9];
        lVar7 = 0;
        do {
          ppAVar5[(long)iVar8 + lVar7 + 1] = pAVar4;
          lVar7 = lVar7 + 1;
        } while (iVar1 - iVar8 != (int)lVar7);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)nSteps);
  }
  pAVar2->nChunksAlloc = 0x40;
  pAVar2->nChunks = 0;
  ppcVar6 = (char **)malloc(0x200);
  pAVar2->pChunks = ppcVar6;
  return pAVar2;
}

Assistant:

Aig_MmStep_t * Aig_MmStepStart( int nSteps )
{
    Aig_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Aig_MmStep_t, 1 );
    memset( p, 0, sizeof(Aig_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Aig_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Aig_MmFixedStart( (8<<i), (1<<13) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Aig_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}